

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlPatternGrow(xmlPatternPtr comp)

{
  int iVar1;
  xmlStepOpPtr pxVar2;
  int newSize;
  xmlStepOpPtr temp;
  xmlPatternPtr comp_local;
  
  iVar1 = xmlGrowCapacity(comp->maxStep,0x18,10,1000000000);
  if (iVar1 < 0) {
    comp_local._4_4_ = -1;
  }
  else {
    pxVar2 = (xmlStepOpPtr)(*xmlRealloc)(comp->steps,(long)iVar1 * 0x18);
    if (pxVar2 == (xmlStepOpPtr)0x0) {
      comp_local._4_4_ = -1;
    }
    else {
      comp->steps = pxVar2;
      comp->maxStep = iVar1;
      comp_local._4_4_ = 0;
    }
  }
  return comp_local._4_4_;
}

Assistant:

static int
xmlPatternGrow(xmlPatternPtr comp) {
    xmlStepOpPtr temp;
    int newSize;

    newSize = xmlGrowCapacity(comp->maxStep, sizeof(temp[0]),
                              10, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    temp = xmlRealloc(comp->steps, newSize * sizeof(temp[0]));
    if (temp == NULL)
        return(-1);
    comp->steps = temp;
    comp->maxStep = newSize;

    return(0);
}